

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O0

int run_test_fs_copyfile(void)

{
  int iVar1;
  int64_t eval_b_23;
  int64_t eval_a_23;
  int64_t eval_b_22;
  int64_t eval_a_22;
  int64_t eval_b_21;
  int64_t eval_a_21;
  int64_t eval_b_20;
  int64_t eval_a_20;
  int64_t eval_b_19;
  int64_t eval_a_19;
  int64_t eval_b_18;
  int64_t eval_a_18;
  int64_t eval_b_17;
  int64_t eval_a_17;
  int64_t eval_b_16;
  int64_t eval_a_16;
  int64_t eval_b_15;
  int64_t eval_a_15;
  int64_t eval_b_14;
  int64_t eval_a_14;
  int64_t eval_b_13;
  int64_t eval_a_13;
  int64_t eval_b_12;
  int64_t eval_a_12;
  int64_t eval_b_11;
  int64_t eval_a_11;
  int64_t eval_b_10;
  int64_t eval_a_10;
  int64_t eval_b_9;
  int64_t eval_a_9;
  int64_t eval_b_8;
  int64_t eval_a_8;
  int64_t eval_b_7;
  int64_t eval_a_7;
  int64_t eval_b_6;
  int64_t eval_a_6;
  int64_t eval_b_5;
  int64_t eval_a_5;
  int64_t eval_b_4;
  int64_t eval_a_4;
  int64_t eval_b_3;
  int64_t eval_a_3;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 local_1e8 [4];
  int r;
  uv_fs_t req;
  uv_loop_t *loop;
  char cStack_18;
  char cStack_17;
  char src [14];
  
  loop._2_1_ = 't';
  loop._3_1_ = 'e';
  loop._4_1_ = 's';
  loop._5_1_ = 't';
  loop._6_1_ = '_';
  loop._7_1_ = 'f';
  cStack_18 = 'i';
  cStack_17 = 'l';
  builtin_strncpy(src,"e_src",6);
  req.bufsml[3].len = uv_default_loop();
  iVar1 = uv_fs_copyfile(0,local_1e8,(long)&loop + 2,"test_file_dst",0xffffffff);
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x6f,"r","==","UV_EINVAL",(long)iVar1,"==",0xffffffffffffffea);
    abort();
  }
  uv_fs_req_cleanup(local_1e8);
  unlink((char *)((long)&loop + 2));
  unlink("test_file_dst");
  iVar1 = uv_fs_copyfile(0,local_1e8,(long)&loop + 2,"test_file_dst",0);
  if (req.cb != (uv_fs_cb)0xfffffffffffffffe) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x76,"req.result","==","UV_ENOENT",req.cb,"==",0xfffffffffffffffe);
    abort();
  }
  if ((long)iVar1 != -2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x77,"r","==","UV_ENOENT",(long)iVar1,"==",0xfffffffffffffffe);
    abort();
  }
  uv_fs_req_cleanup(local_1e8);
  iVar1 = uv_fs_stat(0,local_1e8,"test_file_dst");
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x7b,"r");
    abort();
  }
  uv_fs_req_cleanup(local_1e8);
  touch_file((char *)((long)&loop + 2),0xc);
  iVar1 = uv_fs_copyfile(0,local_1e8,(long)&loop + 2,(long)&loop + 2,0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x81,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  uv_fs_req_cleanup(local_1e8);
  iVar1 = uv_fs_stat(0,local_1e8,(long)&loop + 2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x85,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if (req.statbuf.st_ino != 0xc) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x86,"12","==","req.statbuf.st_size",0xc,"==",req.statbuf.st_ino);
    abort();
  }
  uv_fs_req_cleanup(local_1e8);
  unlink((char *)((long)&loop + 2));
  unlink("test_file_dst");
  iVar1 = uv_fs_copyfile(0,local_1e8,"test/fixtures/load_error.node","test_file_dst",0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x8d,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  handle_result((uv_fs_t *)local_1e8);
  unlink("test_file_dst");
  touch_file((char *)((long)&loop + 2),0);
  iVar1 = uv_fs_copyfile(0,local_1e8,(long)&loop + 2,"test_file_dst",0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x94,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  handle_result((uv_fs_t *)local_1e8);
  iVar1 = uv_fs_copyfile(0,local_1e8,"test/fixtures/load_error.node","test_file_dst",0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x99,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  handle_result((uv_fs_t *)local_1e8);
  iVar1 = uv_fs_chmod(0,local_1e8,"test_file_dst",0x1a4);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0x9d,"uv_fs_chmod(((void*)0), &req, dst, 0644, ((void*)0))","==","0",(long)iVar1,"==",0
           );
    abort();
  }
  uv_fs_req_cleanup(local_1e8);
  iVar1 = uv_fs_copyfile(0,local_1e8,"test/fixtures/load_error.node","test_file_dst",1);
  if ((long)iVar1 != -0x11) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0xa0,"r","==","UV_EEXIST",(long)iVar1,"==",0xffffffffffffffef);
    abort();
  }
  uv_fs_req_cleanup(local_1e8);
  iVar1 = uv_fs_chmod(0,local_1e8,"test_file_dst",0x1a4);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0xa4,"uv_fs_chmod(((void*)0), &req, dst, 0644, ((void*)0))","==","0",(long)iVar1,"==",0
           );
    abort();
  }
  uv_fs_req_cleanup(local_1e8);
  touch_file((char *)((long)&loop + 2),1);
  iVar1 = uv_fs_copyfile(0,local_1e8,(long)&loop + 2,"test_file_dst",0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0xa8,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  handle_result((uv_fs_t *)local_1e8);
  unlink("test_file_dst");
  touch_file((char *)((long)&loop + 2),0x2000);
  iVar1 = uv_fs_copyfile(0,local_1e8,(long)&loop + 2,"test_file_dst",0);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0xaf,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  handle_result((uv_fs_t *)local_1e8);
  unlink((char *)((long)&loop + 2));
  unlink("test_file_dst");
  iVar1 = uv_fs_copyfile(req.bufsml[3].len,local_1e8,"test/fixtures/load_error.node","test_file_dst"
                         ,0,handle_result);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0xb6,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if ((long)result_check_count != 5) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0xb7,"5","==","result_check_count",5,"==",(long)result_check_count);
    abort();
  }
  uv_run(req.bufsml[3].len,0);
  if ((long)result_check_count != 6) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0xb9,"6","==","result_check_count",6,"==",(long)result_check_count);
    abort();
  }
  iVar1 = uv_fs_chmod(0,local_1e8,"test_file_dst",0x1a4);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0xbb,"uv_fs_chmod(((void*)0), &req, dst, 0644, ((void*)0))","==","0",(long)iVar1,"==",0
           );
    abort();
  }
  uv_fs_req_cleanup(local_1e8);
  unlink("test_file_dst");
  iVar1 = uv_fs_copyfile(req.bufsml[3].len,local_1e8,"test/fixtures/load_error.node","test_file_dst"
                         ,0xffffffff,fail_cb);
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0xc1,"r","==","UV_EINVAL",(long)iVar1,"==",0xffffffffffffffea);
    abort();
  }
  uv_run(req.bufsml[3].len,0);
  unlink("test_file_dst");
  iVar1 = uv_fs_copyfile(0,local_1e8,"test/fixtures/load_error.node","test_file_dst",2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,199,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  handle_result((uv_fs_t *)local_1e8);
  unlink("test_file_dst");
  iVar1 = uv_fs_copyfile(0,local_1e8,"test/fixtures/load_error.node","test_file_dst",4);
  if (0 < (long)iVar1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0xce,"r","<=","0",(long)iVar1,"<=",0);
    abort();
  }
  if (iVar1 == 0) {
    handle_result((uv_fs_t *)local_1e8);
  }
  unlink("test_file_dst");
  touch_file("test_file_dst",0);
  chmod("test_file_dst",0x124);
  iVar1 = uv_fs_copyfile(0,local_1e8,"test/fixtures/load_error.node","test_file_dst",0);
  if (req.cb != (uv_fs_cb)0xfffffffffffffff3) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0xdb,"req.result","==","UV_EACCES",req.cb,"==",0xfffffffffffffff3);
    abort();
  }
  if ((long)iVar1 != -0xd) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0xdc,"r","==","UV_EACCES",(long)iVar1,"==",0xfffffffffffffff3);
    abort();
  }
  uv_fs_req_cleanup(local_1e8);
  unlink("test_file_dst");
  close_loop((uv_loop_t *)req.bufsml[3].len);
  iVar1 = uv_loop_close(req.bufsml[3].len);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-copyfile.c"
            ,0xe2,"0","==","uv_loop_close(loop)",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(fs_copyfile) {
  const char src[] = "test_file_src";
  uv_loop_t* loop;
  uv_fs_t req;
  int r;

  loop = uv_default_loop();

  /* Fails with EINVAL if bad flags are passed. */
  r = uv_fs_copyfile(NULL, &req, src, dst, -1, NULL);
  ASSERT_EQ(r, UV_EINVAL);
  uv_fs_req_cleanup(&req);

  /* Fails with ENOENT if source does not exist. */
  unlink(src);
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_EQ(req.result, UV_ENOENT);
  ASSERT_EQ(r, UV_ENOENT);
  uv_fs_req_cleanup(&req);
  /* The destination should not exist. */
  r = uv_fs_stat(NULL, &req, dst, NULL);
  ASSERT(r);
  uv_fs_req_cleanup(&req);

  /* Succeeds if src and dst files are identical. */
  touch_file(src, 12);
  r = uv_fs_copyfile(NULL, &req, src, src, 0, NULL);
  ASSERT_OK(r);
  uv_fs_req_cleanup(&req);
  /* Verify that the src file did not get truncated. */
  r = uv_fs_stat(NULL, &req, src, NULL);
  ASSERT_OK(r);
  ASSERT_EQ(12, req.statbuf.st_size);
  uv_fs_req_cleanup(&req);
  unlink(src);

  /* Copies file synchronously. Creates new file. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies a file of size zero. */
  unlink(dst);
  touch_file(src, 0);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies file synchronously. Overwrites existing file. */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Fails to overwrites existing file. */
  ASSERT_OK(uv_fs_chmod(NULL, &req, dst, 0644, NULL));
  uv_fs_req_cleanup(&req);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_EXCL, NULL);
  ASSERT_EQ(r, UV_EEXIST);
  uv_fs_req_cleanup(&req);

  /* Truncates when an existing destination is larger than the source file. */
  ASSERT_OK(uv_fs_chmod(NULL, &req, dst, 0644, NULL));
  uv_fs_req_cleanup(&req);
  touch_file(src, 1);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies a larger file. */
  unlink(dst);
  touch_file(src, 4096 * 2);
  r = uv_fs_copyfile(NULL, &req, src, dst, 0, NULL);
  ASSERT_OK(r);
  handle_result(&req);
  unlink(src);

  /* Copies file asynchronously */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, 0, handle_result);
  ASSERT_OK(r);
  ASSERT_EQ(5, result_check_count);
  uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_EQ(6, result_check_count);
  /* Ensure file is user-writable (not copied from src). */
  ASSERT_OK(uv_fs_chmod(NULL, &req, dst, 0644, NULL));
  uv_fs_req_cleanup(&req);

  /* If the flags are invalid, the loop should not be kept open */
  unlink(dst);
  r = uv_fs_copyfile(loop, &req, fixture, dst, -1, fail_cb);
  ASSERT_EQ(r, UV_EINVAL);
  uv_run(loop, UV_RUN_DEFAULT);

  /* Copies file using UV_FS_COPYFILE_FICLONE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE, NULL);
  ASSERT_OK(r);
  handle_result(&req);

  /* Copies file using UV_FS_COPYFILE_FICLONE_FORCE. */
  unlink(dst);
  r = uv_fs_copyfile(NULL, &req, fixture, dst, UV_FS_COPYFILE_FICLONE_FORCE,
                     NULL);
  ASSERT_LE(r, 0);

  if (r == 0)
    handle_result(&req);

#ifndef _WIN32
  /* Copying respects permissions/mode. */
  unlink(dst);
  touch_file(dst, 0);
  chmod(dst, S_IRUSR|S_IRGRP|S_IROTH); /* Sets file mode to 444 (read-only). */
  r = uv_fs_copyfile(NULL, &req, fixture, dst, 0, NULL);
  /* On IBMi PASE, qsecofr users can overwrite read-only files */
# ifndef __PASE__
  ASSERT_EQ(req.result, UV_EACCES);
  ASSERT_EQ(r, UV_EACCES);
# endif
  uv_fs_req_cleanup(&req);
#endif

  unlink(dst); /* Cleanup */
  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}